

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::DOMRangeImpl::isValidAncestorType(DOMRangeImpl *this,DOMNode *node)

{
  short sVar1;
  int iVar2;
  undefined4 extraout_var;
  DOMNode *pDStack_28;
  short type;
  DOMNode *aNode;
  DOMNode *node_local;
  DOMRangeImpl *this_local;
  
  pDStack_28 = node;
  while( true ) {
    if (pDStack_28 == (DOMNode *)0x0) {
      return true;
    }
    iVar2 = (*pDStack_28->_vptr_DOMNode[4])();
    sVar1 = (short)iVar2;
    if (((sVar1 == 6) || (sVar1 == 0xc)) || (sVar1 == 10)) break;
    iVar2 = (*pDStack_28->_vptr_DOMNode[5])();
    pDStack_28 = (DOMNode *)CONCAT44(extraout_var,iVar2);
  }
  return false;
}

Assistant:

bool DOMRangeImpl::isValidAncestorType(const DOMNode* node) const
{
    for (DOMNode* aNode = (DOMNode*) node; aNode!=0; aNode = aNode->getParentNode()) {
        short type = aNode->getNodeType();
        if ( type == DOMNode::ENTITY_NODE
            || type == DOMNode::NOTATION_NODE
            || type == DOMNode::DOCUMENT_TYPE_NODE)
            return false;
    }
    return true;
}